

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::SwitchStmt::clear(SwitchStmt *this)

{
  _Base_ptr p_Var1;
  
  (*(((this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  for (p_Var1 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->body_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(*(long *)p_Var1[1]._M_left + 0x60))();
  }
  return;
}

Assistant:

void SwitchStmt::clear() {
    target_stmt_->clear();
    for (auto const &iter : body_) {
        iter.second->clear();
    }
}